

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O2

int point_mul_g_id_GostR3410_2001_TestParamSet(EC_GROUP *group,EC_POINT *r,BIGNUM *n,BN_CTX *ctx)

{
  uint64_t *puVar1;
  char cVar2;
  int iVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  long lVar6;
  byte arg1;
  int iVar7;
  pt_aff_t_conflict (*papVar8) [16];
  pt_aff_t_conflict *arg3;
  uint uVar9;
  long lVar10;
  bool bVar11;
  uchar b_y [32];
  uint64_t local_1a8 [8];
  uchar b_n [32];
  uchar b_x [32];
  uint64_t local_128 [8];
  pt_aff_t_conflict local_e8;
  uint64_t local_a8 [4];
  uint64_t local_88 [4];
  int8_t rnaf [52];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar4 = BN_CTX_get((BN_CTX *)ctx);
  pBVar5 = BN_CTX_get((BN_CTX *)ctx);
  iVar7 = 0;
  if ((pBVar5 != (BIGNUM *)0x0) && (iVar3 = BN_bn2lebinpad(n,b_n,0x20), iVar3 == 0x20)) {
    rnaf[0x20] = '\0';
    rnaf[0x21] = '\0';
    rnaf[0x22] = '\0';
    rnaf[0x23] = '\0';
    rnaf[0x24] = '\0';
    rnaf[0x25] = '\0';
    rnaf[0x26] = '\0';
    rnaf[0x27] = '\0';
    rnaf[0x28] = '\0';
    rnaf[0x29] = '\0';
    rnaf[0x2a] = '\0';
    rnaf[0x2b] = '\0';
    rnaf[0x2c] = '\0';
    rnaf[0x2d] = '\0';
    rnaf[0x2e] = '\0';
    rnaf[0x2f] = '\0';
    rnaf[0x10] = '\0';
    rnaf[0x11] = '\0';
    rnaf[0x12] = '\0';
    rnaf[0x13] = '\0';
    rnaf[0x14] = '\0';
    rnaf[0x15] = '\0';
    rnaf[0x16] = '\0';
    rnaf[0x17] = '\0';
    rnaf[0x18] = '\0';
    rnaf[0x19] = '\0';
    rnaf[0x1a] = '\0';
    rnaf[0x1b] = '\0';
    rnaf[0x1c] = '\0';
    rnaf[0x1d] = '\0';
    rnaf[0x1e] = '\0';
    rnaf[0x1f] = '\0';
    rnaf[0x30] = '\0';
    rnaf[0x31] = '\0';
    rnaf[0x32] = '\0';
    rnaf[0x33] = '\0';
    rnaf[0] = '\0';
    rnaf[1] = '\0';
    rnaf[2] = '\0';
    rnaf[3] = '\0';
    rnaf[4] = '\0';
    rnaf[5] = '\0';
    rnaf[6] = '\0';
    rnaf[7] = '\0';
    rnaf[8] = '\0';
    rnaf[9] = '\0';
    rnaf[10] = '\0';
    rnaf[0xb] = '\0';
    rnaf[0xc] = '\0';
    rnaf[0xd] = '\0';
    rnaf[0xe] = '\0';
    rnaf[0xf] = '\0';
    local_1a8[6] = 0;
    local_1a8[7] = 0;
    local_1a8[4] = 0;
    local_1a8[5] = 0;
    local_1a8[2] = 0;
    local_1a8[3] = 0;
    local_1a8[0] = 0;
    local_1a8[1] = 0;
    b_y[0x10] = '\0';
    b_y[0x11] = '\0';
    b_y[0x12] = '\0';
    b_y[0x13] = '\0';
    b_y[0x14] = '\0';
    b_y[0x15] = '\0';
    b_y[0x16] = '\0';
    b_y[0x17] = '\0';
    b_y[0x18] = '\0';
    b_y[0x19] = '\0';
    b_y[0x1a] = '\0';
    b_y[0x1b] = '\0';
    b_y[0x1c] = '\0';
    b_y[0x1d] = '\0';
    b_y[0x1e] = '\0';
    b_y[0x1f] = '\0';
    b_y[0] = '\0';
    b_y[1] = '\0';
    b_y[2] = '\0';
    b_y[3] = '\0';
    b_y[4] = '\0';
    b_y[5] = '\0';
    b_y[6] = '\0';
    b_y[7] = '\0';
    b_y[8] = '\0';
    b_y[9] = '\0';
    b_y[10] = '\0';
    b_y[0xb] = '\0';
    b_y[0xc] = '\0';
    b_y[0xd] = '\0';
    b_y[0xe] = '\0';
    b_y[0xf] = '\0';
    puVar1 = local_e8.Y;
    local_e8.Y[2] = 0;
    local_e8.Y[3] = 0;
    local_e8.Y[0] = 0;
    local_e8.Y[1] = 0;
    local_e8.X[2] = 0;
    local_e8.X[3] = 0;
    local_e8.X[0] = 0;
    local_e8.X[1] = 0;
    scalar_rwnaf(rnaf,b_n);
    b_x[0x10] = '\0';
    b_x[0x11] = '\0';
    b_x[0x12] = '\0';
    b_x[0x13] = '\0';
    b_x[0x14] = '\0';
    b_x[0x15] = '\0';
    b_x[0x16] = '\0';
    b_x[0x17] = '\0';
    b_x[0x18] = '\0';
    b_x[0x19] = '\0';
    b_x[0x1a] = '\0';
    b_x[0x1b] = '\0';
    b_x[0x1c] = '\0';
    b_x[0x1d] = '\0';
    b_x[0x1e] = '\0';
    b_x[0x1f] = '\0';
    b_x[0] = '\0';
    b_x[1] = '\0';
    b_x[2] = '\0';
    b_x[3] = '\0';
    b_x[4] = '\0';
    b_x[5] = '\0';
    b_x[6] = '\0';
    b_x[7] = '\0';
    b_x[8] = '\0';
    b_x[9] = '\0';
    b_x[10] = '\0';
    b_x[0xb] = '\0';
    b_x[0xc] = '\0';
    b_x[0xd] = '\0';
    b_x[0xe] = '\0';
    b_x[0xf] = '\0';
    local_128[0] = 0xfffffffffffffbcf;
    local_128[1] = 0xffffffffffffffff;
    local_128[2] = 0xffffffffffffffff;
    local_128[3] = 0x7fffffffffffffff;
    local_128[4] = 0;
    local_128[5] = 0;
    local_128[6] = 0;
    local_128[7] = 0;
    for (uVar9 = 1; -1 < (int)uVar9; uVar9 = uVar9 - 1) {
      if (uVar9 != 1) {
        iVar7 = 5;
        while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
          point_double((pt_prj_t_conflict *)b_x,(pt_prj_t_conflict *)b_x);
        }
      }
      papVar8 = lut_cmb;
      for (lVar6 = 0; lVar6 != 0x1b; lVar6 = lVar6 + 1) {
        lVar10 = (ulong)uVar9 + lVar6 * 2;
        if ((int)lVar10 < 0x34) {
          cVar2 = rnaf[lVar10];
          lVar10 = 0;
          arg3 = *papVar8;
          for (; lVar10 != 0x10; lVar10 = lVar10 + 1) {
            bVar11 = (int)((int)(char)(-1 - (cVar2 >> 7)) + ((int)cVar2 >> 0x1f ^ (int)cVar2) >> 1 ^
                          (uint)lVar10) < 1;
            fiat_id_GostR3410_2001_TestParamSet_selectznz(local_e8.X,bVar11,local_e8.X,arg3->X);
            fiat_id_GostR3410_2001_TestParamSet_selectznz(puVar1,bVar11,puVar1,arg3->Y);
            arg3 = arg3 + 1;
          }
          fiat_id_GostR3410_2001_TestParamSet_opp(local_88,puVar1);
          fiat_id_GostR3410_2001_TestParamSet_selectznz
                    (puVar1,(byte)(cVar2 >> 7) >> 7,puVar1,local_88);
          point_add_mixed((pt_prj_t_conflict *)b_x,(pt_prj_t_conflict *)b_x,&local_e8);
        }
        papVar8 = (pt_aff_t_conflict (*) [16])((long)papVar8 + 0x400);
      }
    }
    local_e8.X[2] = 0xffffffffffffffff;
    local_e8.X[3] = 0x7fffffffffffffff;
    local_e8.X[0] = 0xfffffffffffff36d;
    local_e8.X[1] = 0xffffffffffffffff;
    fiat_id_GostR3410_2001_TestParamSet_opp(puVar1,lut_cmb[0][0].Y);
    point_add_mixed((pt_prj_t_conflict *)b_y,(pt_prj_t_conflict *)b_x,&local_e8);
    arg1 = b_n[0] & 1;
    fiat_id_GostR3410_2001_TestParamSet_selectznz
              ((uint64_t *)b_x,arg1,(uint64_t *)b_y,(uint64_t *)b_x);
    fiat_id_GostR3410_2001_TestParamSet_selectznz(local_128,arg1,local_1a8,local_128);
    puVar1 = local_128 + 4;
    fiat_id_GostR3410_2001_TestParamSet_selectznz(puVar1,arg1,local_1a8 + 4,puVar1);
    fiat_id_GostR3410_2001_TestParamSet_inv(puVar1,puVar1);
    fiat_id_GostR3410_2001_TestParamSet_mul(local_a8,(uint64_t *)b_x,puVar1);
    fiat_id_GostR3410_2001_TestParamSet_mul(local_88,local_128,puVar1);
    fiat_id_GostR3410_2001_TestParamSet_from_montgomery(local_a8,local_a8);
    fiat_id_GostR3410_2001_TestParamSet_from_montgomery(local_88,local_88);
    fiat_id_GostR3410_2001_TestParamSet_to_bytes(b_x,local_a8);
    fiat_id_GostR3410_2001_TestParamSet_to_bytes(b_y,local_88);
    iVar7 = CRYPTO_memcmp("",b_x,0x20);
    if ((iVar7 == 0) && (iVar7 = CRYPTO_memcmp("",b_y,0x20), iVar7 == 0)) {
      iVar7 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar7 == 0) {
        iVar7 = 0;
        goto LAB_001283b0;
      }
    }
    else {
      lVar6 = BN_lebin2bn(b_x,0x20,pBVar4);
      iVar7 = 0;
      if ((lVar6 == 0) ||
         ((lVar6 = BN_lebin2bn(b_y,0x20,pBVar5), lVar6 == 0 ||
          (iVar3 = EC_POINT_set_affine_coordinates(group,r,pBVar4,pBVar5,ctx), iVar3 == 0))))
      goto LAB_001283b0;
    }
    iVar7 = 1;
  }
LAB_001283b0:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar7;
}

Assistant:

int
    point_mul_g_id_GostR3410_2001_TestParamSet(const EC_GROUP *group,
                                               EC_POINT *r, const BIGNUM *n,
                                               BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_n[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL || BN_bn2lebinpad(n, b_n, 32) != 32)
        goto err;
    /* do the fixed scalar multiplication */
    point_mul_g(b_x, b_y, b_n);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}